

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_UUID __thiscall ON_XMLVariant::AsUuid(ON_XMLVariant *this)

{
  Types TVar1;
  wchar_t *sUUID;
  ON_XMLVariant *this_local;
  
  TVar1 = this->_private->_type;
  if (TVar1 == String) {
    sUUID = ON_wString::operator_cast_to_wchar_t_(&this->_private->_string_val);
    _this_local = ON_UuidFromString(sUUID);
  }
  else if (TVar1 == Uuid) {
    _this_local = (this->_private->field_2)._uuid_val;
  }
  else {
    _this_local = (ON_UUID)ZEXT816(0);
  }
  return _this_local;
}

Assistant:

ON_UUID ON_XMLVariant::AsUuid(void) const
{
  switch (_private->_type)
  {
  case Types::String:
    return ON_UuidFromString(_private->_string_val);

  case Types::Uuid:
    return _private->_uuid_val;

  default:
    return ON_nil_uuid;
  }
}